

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Reg2U(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint index)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  uint uStack_20;
  bool success;
  RegSlot local_1c;
  uint index_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_20 = index;
  local_1c = R1;
  index_local = R0;
  R1_local._2_2_ = op;
  _R0_local = this;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8e1,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  op_00 = R1_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,Reg2U);
  CheckOp(this,op_00,local_24);
  CheckOpen(this);
  index_local = ConsumeReg(this,index_local);
  local_1c = ConsumeReg(this,local_1c);
  bVar2 = TryWriteReg2U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,R1_local._2_2_,index_local,local_1c,uStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteReg2U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,R1_local._2_2_,index_local,local_1c,uStack_20), !bVar2)) &&
     (bVar2 = TryWriteReg2U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,R1_local._2_2_,index_local,local_1c,uStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8e8,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg2U(OpCode op, RegSlot R0, RegSlot R1, uint index)
    {
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckOp(op, OpLayoutType::Reg2U);
        CheckOpen();

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(Reg2U, op, R0, R1, index);
    }